

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityReferenceImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMEntityReferenceImpl::DOMEntityReferenceImpl
          (DOMEntityReferenceImpl *this,DOMDocument *ownerDoc,XMLCh *entityName,bool cloneChild)

{
  DOMDocument *pDVar1;
  int iVar2;
  XMLCh *pXVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  long *plVar5;
  DOMNode *other;
  DOMDocumentImpl *local_88;
  DOMNode *local_58;
  DOMEntityReference *refEntity;
  DOMEntityImpl *entity;
  bool cloneChild_local;
  XMLCh *entityName_local;
  DOMDocument *ownerDoc_local;
  DOMEntityReferenceImpl *this_local;
  
  DOMEntityReference::DOMEntityReference(&this->super_DOMEntityReference);
  HasDOMNodeImpl::HasDOMNodeImpl(&this->super_HasDOMNodeImpl);
  HasDOMParentImpl::HasDOMParentImpl(&this->super_HasDOMParentImpl);
  HasDOMChildImpl::HasDOMChildImpl(&this->super_HasDOMChildImpl);
  (this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052aad0;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052ac58;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052ac88;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMEntityReferenceImpl_0052acb8;
  local_58 = (DOMNode *)0x0;
  if (ownerDoc != (DOMDocument *)0x0) {
    local_58 = &ownerDoc->super_DOMNode;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,local_58);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  this->fBaseURI = (XMLCh *)0x0;
  pDVar1 = (this->fParent).fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_88 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_88 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  pXVar3 = DOMDocumentImpl::getPooledString(local_88,entityName);
  this->fName = pXVar3;
  if ((ownerDoc != (DOMDocument *)0x0) &&
     (iVar2 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(),
     CONCAT44(extraout_var,iVar2) != 0)) {
    iVar2 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x148))();
    if (lVar4 != 0) {
      iVar2 = (*(ownerDoc->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
      plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x148))();
      plVar5 = (long *)(**(code **)(*plVar5 + 0x20))(plVar5,entityName);
      if (plVar5 != (long *)0x0) {
        pXVar3 = (XMLCh *)(**(code **)(*plVar5 + 0xf8))();
        this->fBaseURI = pXVar3;
        if ((cloneChild) &&
           (other = (DOMNode *)(**(code **)(*plVar5 + 0x1b0))(), other != (DOMNode *)0x0)) {
          DOMParentNode::cloneChildren(&this->fParent,other);
        }
      }
    }
  }
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityReferenceImpl::DOMEntityReferenceImpl(DOMDocument *ownerDoc,
                                         const XMLCh *entityName,
                                         bool cloneChild)
    : fNode(this, ownerDoc), fParent(this, ownerDoc), fBaseURI(0)
{
    fName = ((DOMDocumentImpl*)fParent.fOwnerDocument)->getPooledString(entityName);
    // EntityReference behaves as a read-only node, since its contents
    // reflect the Entity it refers to -- but see setNodeName().
    //retrieve the corresponding entity content

    if (ownerDoc) {
        if (ownerDoc->getDoctype()) {
            if (ownerDoc->getDoctype()->getEntities()) {
                DOMEntityImpl* entity = (DOMEntityImpl*)ownerDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                if (entity) {
                    fBaseURI = entity->getBaseURI();
                    if (cloneChild) {
                        DOMEntityReference* refEntity = entity->getEntityRef();
                        if (refEntity) {
                            fParent.cloneChildren(refEntity);
                        }
                    }
                }
            }
        }
    }

    fNode.setReadOnly(true, true);
}